

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O1

wchar_t critical_shot(player *p,monster_conflict *monster,wchar_t weight,wchar_t plus,wchar_t dam,
                     _Bool launched,uint32_t *msg_type)

{
  short sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  critical_level *pcVar6;
  uint32_t uVar7;
  critical_level *pcVar8;
  int iVar9;
  int iVar10;
  
  iVar9 = plus + (p->state).to_h;
  if ((((0 < monster->m_timed[2]) || (0 < monster->m_timed[6])) || (0 < monster->m_timed[3])) ||
     (0 < monster->m_timed[1])) {
    iVar9 = iVar9 + z_info->r_crit_debuff_toh;
  }
  iVar2 = z_info->r_crit_chance_weight_scl;
  iVar3 = z_info->r_crit_chance_toh_scl;
  sVar1 = p->lev;
  iVar4 = z_info->r_crit_chance_level_scl;
  iVar5 = z_info->r_crit_chance_offset;
  if (launched) {
    iVar10 = (p->state).skills[7] * z_info->r_crit_chance_launched_toh_skill_scl;
  }
  else {
    iVar10 = (p->state).skills[8] * z_info->r_crit_chance_thrown_toh_skill_scl;
  }
  uVar7 = Rand_div(z_info->r_crit_chance_range);
  if (((int)uVar7 < iVar9 * iVar3 + iVar2 * weight + iVar5 + sVar1 * iVar4 + iVar10) &&
     (z_info->r_crit_level_head != (critical_level *)0x0)) {
    iVar9 = z_info->r_crit_power_weight_scl;
    uVar7 = Rand_div(z_info->r_crit_power_random);
    pcVar6 = z_info->r_crit_level_head;
    do {
      pcVar8 = pcVar6;
      if (weight * iVar9 + uVar7 + L'\x01' < pcVar8->cutoff) break;
      pcVar6 = pcVar8->next;
    } while (pcVar8->next != (critical_level *)0x0);
    *msg_type = pcVar8->msgt;
    dam = dam * pcVar8->mult + pcVar8->add;
  }
  else {
    *msg_type = 0x55;
  }
  return dam;
}

Assistant:

static int critical_shot(const struct player *p,
		const struct monster *monster,
		int weight, int plus,
		int dam, bool launched, uint32_t *msg_type)
{
	int to_h = p->state.to_h + plus;
	int chance, new_dam;

	if (is_debuffed(monster)) {
		to_h += z_info->r_crit_debuff_toh;
	}
	chance = z_info->r_crit_chance_weight_scl * weight
		+ z_info->r_crit_chance_toh_scl * to_h
		+ z_info->r_crit_chance_level_scl * p->lev
		+ z_info->r_crit_chance_offset;
	if (launched) {
		chance += z_info->r_crit_chance_launched_toh_skill_scl
			* p->state.skills[SKILL_TO_HIT_BOW];
	} else {
		chance += z_info->r_crit_chance_thrown_toh_skill_scl
			* p->state.skills[SKILL_TO_HIT_THROW];
	}

	if (randint1(z_info->r_crit_chance_range) > chance
			|| !z_info->r_crit_level_head) {
		*msg_type = MSG_SHOOT_HIT;
		new_dam = dam;
	} else {
		int power = z_info->r_crit_power_weight_scl * weight
			+ randint1(z_info->r_crit_power_random);
		const struct critical_level *this_l = z_info->r_crit_level_head;

		while (power >= this_l->cutoff && this_l->next) {
			this_l = this_l->next;
		}
		*msg_type = this_l->msgt;
		new_dam = this_l->add + this_l->mult * dam;
	}

	return new_dam;
}